

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int countNamelessRecords(int m,int firstcode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = firstNamelessRecord(m,firstcode);
  iVar2 = coDex(m);
  do {
    iVar3 = coDex(m);
    m = m + 1;
  } while (iVar3 == iVar2);
  return ~uVar1 + m;
}

Assistant:

static int countNamelessRecords(const int m, const int firstcode) {
    const int first = firstNamelessRecord(m, firstcode);
    const int codexm = coDex(m);
    int last = m;
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (coDex(last) == codexm) {
        last++;
    }
    ASSERT((0 <= last) && (last <= MAPCODE_BOUNDARY_MAX));
    ASSERT(last >= first);
    return (last - first);
}